

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void replace_default_logger_example(void)

{
  shared_ptr<spdlog::logger> new_logger;
  shared_ptr<spdlog::logger> old_logger;
  shared_ptr<spdlog::logger> *in_stack_fffffffffffffeb8;
  file_event_handlers *in_stack_fffffffffffffec0;
  shared_ptr<spdlog::logger> local_120;
  shared_ptr<spdlog::logger> *in_stack_fffffffffffffef0;
  file_event_handlers *in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff0f;
  filename_t *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [64];
  
  spdlog::default_logger();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"new_default_logger",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"logs/new-default-log.txt",&local_79);
  spdlog::file_event_handlers::file_event_handlers(in_stack_fffffffffffffec0);
  spdlog::basic_logger_mt<spdlog::synchronous_factory>
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f,
             in_stack_ffffffffffffff00);
  spdlog::file_event_handlers::~file_event_handlers(in_stack_fffffffffffffec0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::shared_ptr<spdlog::logger>::shared_ptr
            ((shared_ptr<spdlog::logger> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  spdlog::set_default_logger(in_stack_fffffffffffffef0);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x10e84e);
  spdlog::set_level(trace);
  spdlog::debug<char[38]>((char (*) [38])0x10e866);
  spdlog::set_level(trace);
  spdlog::debug<char[35]>((char (*) [35])0x10e87d);
  std::shared_ptr<spdlog::logger>::shared_ptr(&local_120,in_stack_fffffffffffffeb8);
  spdlog::set_default_logger(in_stack_fffffffffffffef0);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x10e8ac);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x10e8b9);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x10e8c6);
  return;
}

Assistant:

void replace_default_logger_example() {
    // store the old logger so we don't break other examples.
    auto old_logger = spdlog::default_logger();

    auto new_logger =
        spdlog::basic_logger_mt("new_default_logger", "logs/new-default-log.txt", true);
    spdlog::set_default_logger(new_logger);
    spdlog::set_level(spdlog::level::info);
    spdlog::debug("This message should not be displayed!");
    spdlog::set_level(spdlog::level::trace);
    spdlog::debug("This message should be displayed..");

    spdlog::set_default_logger(old_logger);
}